

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O2

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double,_double>,_Eigen::internal::redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_0,_0>
       ::run(redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
             *mat,scalar_sum_op<double,_double> *func)

{
  long lVar1;
  double *pdVar2;
  double dVar3;
  
  lVar1 = (mat->m_xpr->
          super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
          ).
          super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
          super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>
          .m_cols.m_value;
  if (0 < lVar1) {
    pdVar2 = (mat->m_evaluator).
             super_block_evaluator<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
             .
             super_mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
             .m_data;
    dVar3 = *pdVar2;
    while (pdVar2 = pdVar2 + (mat->m_evaluator).
                             super_block_evaluator<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
                             .
                             super_mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                             .m_innerStride.m_value, lVar1 = lVar1 + -1, lVar1 != 0) {
      dVar3 = dVar3 + *pdVar2;
    }
    return dVar3;
  }
  __assert_fail("mat.rows()>0 && mat.cols()>0 && \"you are using an empty matrix\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/Redux.h"
                ,0xc0,
                "static Scalar Eigen::internal::redux_impl<Eigen::internal::scalar_sum_op<double>, Eigen::internal::redux_evaluator<Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>>>::run(const Derived &, const Func &) [Func = Eigen::internal::scalar_sum_op<double>, Derived = Eigen::internal::redux_evaluator<Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>>, Traversal = 0, Unrolling = 0]"
               );
}

Assistant:

Scalar run(const Derived &mat, const Func& func)
  {
    eigen_assert(mat.rows()>0 && mat.cols()>0 && "you are using an empty matrix");
    Scalar res;
    res = mat.coeffByOuterInner(0, 0);
    for(Index i = 1; i < mat.innerSize(); ++i)
      res = func(res, mat.coeffByOuterInner(0, i));
    for(Index i = 1; i < mat.outerSize(); ++i)
      for(Index j = 0; j < mat.innerSize(); ++j)
        res = func(res, mat.coeffByOuterInner(i, j));
    return res;
  }